

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O0

rect_i agge::renderer::
       adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
       ::make_window(bitmap<unsigned_short,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window)

{
  rect_i rVar1;
  count_t cVar2;
  rect_i *window_local;
  bitmap<unsigned_short,_0UL,_0UL> *bitmap__local;
  vector_i offset_local;
  rect_i w;
  
  bitmap__local._0_4_ = offset.dx;
  offset_local.dx = (int)bitmap__local;
  bitmap__local._4_4_ = offset.dy;
  offset_local.dy = bitmap__local._4_4_;
  cVar2 = agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>::width(bitmap_);
  w.x1 = cVar2 + (int)bitmap__local;
  cVar2 = agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>::height(bitmap_);
  w.y1 = cVar2 + bitmap__local._4_4_;
  if (window != (rect_i *)0x0) {
    update_max<int>(&offset_local.dx,window->x1);
    update_max<int>(&offset_local.dy,window->y1);
    update_min<int>(&w.x1,window->x2);
    update_min<int>(&w.y1,window->y2);
  }
  rVar1.y1 = offset_local.dy;
  rVar1.x1 = offset_local.dx;
  rVar1.x2 = w.x1;
  rVar1.y2 = w.y1;
  return rVar1;
}

Assistant:

inline rect_i renderer::adapter<BitmapT, BlenderT>::make_window(BitmapT &bitmap_, vector_i offset,
		const rect_i * window)
	{
		rect_i w = {
			offset.dx, offset.dy,
			static_cast<int>(bitmap_.width()) + offset.dx, static_cast<int>(bitmap_.height()) + offset.dy
		};

		if (window)
		{
			update_max(w.x1, window->x1);
			update_max(w.y1, window->y1);
			update_min(w.x2, window->x2);
			update_min(w.y2, window->y2);
		}
		return w;
	}